

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

mpc_parser_t * mpc_and(int n,mpc_fold_t f,...)

{
  char in_AL;
  void *pvVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  void *in_RSI;
  int in_EDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  mpc_parser_t *p;
  va_list va;
  int i;
  undefined8 *local_128;
  undefined8 *local_110;
  undefined8 local_f8 [4];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  mpc_parser_t *local_40;
  uint local_38;
  undefined8 *local_30;
  int local_14;
  void *local_10;
  int local_4;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  local_f8[2] = in_RDX;
  local_f8[3] = in_RCX;
  local_d8 = in_R8;
  local_d0 = in_R9;
  local_10 = in_RSI;
  local_4 = in_EDI;
  local_40 = mpc_undefined();
  local_40->type = '\x18';
  (local_40->data).repeat.n = local_4;
  (local_40->data).lift.x = local_10;
  pvVar1 = malloc((long)local_4 << 3);
  (local_40->data).apply_to.d = pvVar1;
  pvVar1 = malloc((long)(local_4 + -1) << 3);
  (local_40->data).check_with.d = pvVar1;
  local_30 = (undefined8 *)&stack0x00000008;
  local_38 = 0x10;
  for (local_14 = 0; local_14 < local_4; local_14 = local_14 + 1) {
    if (local_38 < 0x29) {
      local_110 = (undefined8 *)((long)local_f8 + (long)(int)local_38);
      local_38 = local_38 + 8;
    }
    else {
      local_110 = local_30;
      local_30 = local_30 + 1;
    }
    *(undefined8 *)((long)(local_40->data).apply_to.d + (long)local_14 * 8) = *local_110;
  }
  for (local_14 = 0; local_14 < local_4 + -1; local_14 = local_14 + 1) {
    if (local_38 < 0x29) {
      local_128 = (undefined8 *)((long)local_f8 + (long)(int)local_38);
      local_38 = local_38 + 8;
    }
    else {
      local_128 = local_30;
      local_30 = local_30 + 1;
    }
    *(undefined8 *)((local_40->data).check.e + (long)local_14 * 8) = *local_128;
  }
  return local_40;
}

Assistant:

mpc_parser_t *mpc_and(int n, mpc_fold_t f, ...) {

  int i;
  va_list va;

  mpc_parser_t *p = mpc_undefined();

  p->type = MPC_TYPE_AND;
  p->data.and.n = n;
  p->data.and.f = f;
  p->data.and.xs = malloc(sizeof(mpc_parser_t*) * n);
  p->data.and.dxs = malloc(sizeof(mpc_dtor_t) * (n-1));

  va_start(va, f);
  for (i = 0; i < n; i++) {
    p->data.and.xs[i] = va_arg(va, mpc_parser_t*);
  }
  for (i = 0; i < (n-1); i++) {
    p->data.and.dxs[i] = va_arg(va, mpc_dtor_t);
  }
  va_end(va);

  return p;
}